

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::InputScalarEx
               (char *label,ImGuiDataType data_type,void *data_ptr,void *step_ptr,
               void *step_fast_ptr,char *scalar_format,ImGuiInputTextFlags extra_flags)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  float *pfVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 button_sz;
  ImVec2 label_size;
  char buf [64];
  ImVec2 local_c0;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  char local_78 [72];
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  if (pIVar2->SkipItems == false) {
    local_a0 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_4_ = local_a0.x;
    local_88._4_4_ = local_a0.y;
    local_88._12_4_ = extraout_XMM0_Dd;
    BeginGroup();
    PushID(label);
    IVar1 = (pIVar4->Style).FramePadding;
    fVar11 = IVar1.x;
    fVar12 = IVar1.y;
    fVar9 = pIVar4->FontSize;
    fVar11 = fVar9 + fVar11 + fVar11;
    fVar12 = fVar9 + fVar12 + fVar12;
    local_c0.y = fVar12;
    local_c0.x = fVar11;
    if (step_ptr != (void *)0x0) {
      fVar10 = (GImGui->CurrentWindow->DC).ItemWidth;
      if (fVar10 < 0.0) {
        local_b8 = (char *)CONCAT44(fVar12,fVar11);
        local_98 = ZEXT416((uint)fVar10);
        fStack_b0 = fVar9 + 0.0;
        fStack_ac = fVar9 + 0.0;
        IVar1 = GetContentRegionAvail();
        fVar9 = (float)local_98._0_4_ + IVar1.x;
        fVar10 = 1.0;
        fVar11 = (float)local_b8;
        if (1.0 <= fVar9) {
          fVar10 = fVar9;
        }
      }
      fVar11 = fVar11 + (pIVar4->Style).ItemInnerSpacing.x;
      fVar11 = (float)(int)fVar10 - (fVar11 + fVar11);
      fVar9 = 1.0;
      if (1.0 <= fVar11) {
        fVar9 = fVar11;
      }
      PushItemWidth(fVar9);
    }
    local_b8 = label;
    if (data_type == ImGuiDataType_Float) {
      ImFormatString(local_78,0x40,scalar_format,SUB84((double)*data_ptr,0));
    }
    else if (data_type == ImGuiDataType_Int) {
      ImFormatString(local_78,0x40,scalar_format,(ulong)*data_ptr);
    }
    bVar7 = false;
    bVar6 = InputText("",local_78,0x40,(uint)((extra_flags & 2U) == 0) | extra_flags | 0x10,
                      (ImGuiTextEditCallback)0x0,(void *)0x0);
    if (bVar6) {
      bVar7 = DataTypeApplyOpFromText
                        (local_78,(GImGui->InputTextState).InitialText.Data,data_type,data_ptr,
                         scalar_format);
    }
    if (step_ptr != (void *)0x0) {
      PopItemWidth();
      pIVar5 = GImGui;
      fVar9 = (pIVar4->Style).ItemInnerSpacing.x;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->Accessed = true;
      if (pIVar3->SkipItems == false) {
        if (fVar9 < 0.0) {
          fVar9 = (pIVar5->Style).ItemSpacing.x;
        }
        (pIVar3->DC).CursorPos.x = fVar9 + (pIVar3->DC).CursorPosPrevLine.x;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
        (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      bVar6 = ButtonEx("-",&local_c0,0x41);
      if (bVar6) {
        pfVar8 = (float *)step_ptr;
        if ((pIVar4->IO).KeyCtrl != false) {
          pfVar8 = (float *)step_fast_ptr;
        }
        if (step_fast_ptr == (void *)0x0) {
          pfVar8 = (float *)step_ptr;
        }
        bVar7 = true;
        if (data_type == ImGuiDataType_Float) {
          *(float *)data_ptr = *data_ptr - *pfVar8;
        }
        else if (data_type == ImGuiDataType_Int) {
          *(int *)data_ptr = *data_ptr - (int)*pfVar8;
        }
      }
      pIVar5 = GImGui;
      fVar9 = (pIVar4->Style).ItemInnerSpacing.x;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->Accessed = true;
      if (pIVar3->SkipItems == false) {
        if (fVar9 < 0.0) {
          fVar9 = (pIVar5->Style).ItemSpacing.x;
        }
        (pIVar3->DC).CursorPos.x = fVar9 + (pIVar3->DC).CursorPosPrevLine.x;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
        (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      bVar6 = ButtonEx("+",&local_c0,0x41);
      if (bVar6) {
        pfVar8 = (float *)step_ptr;
        if ((pIVar4->IO).KeyCtrl != false) {
          pfVar8 = (float *)step_fast_ptr;
        }
        if (step_fast_ptr == (void *)0x0) {
          pfVar8 = (float *)step_ptr;
        }
        bVar7 = true;
        if (data_type == ImGuiDataType_Float) {
          *(float *)data_ptr = *data_ptr + *pfVar8;
        }
        else if (data_type == ImGuiDataType_Int) {
          *(int *)data_ptr = *data_ptr + (int)*pfVar8;
        }
      }
    }
    PopID();
    pIVar5 = GImGui;
    if (0.0 < (float)local_88._0_4_) {
      fVar9 = (pIVar4->Style).ItemInnerSpacing.x;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->Accessed = true;
      if (pIVar3->SkipItems == false) {
        if (fVar9 < 0.0) {
          fVar9 = (pIVar5->Style).ItemSpacing.x;
        }
        (pIVar3->DC).CursorPos.x = fVar9 + (pIVar3->DC).CursorPosPrevLine.x;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrentLineHeight = (pIVar3->DC).PrevLineHeight;
        (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      IVar1.y = (pIVar2->DC).CursorPos.y + (pIVar4->Style).FramePadding.y;
      IVar1.x = (pIVar2->DC).CursorPos.x;
      RenderText(IVar1,local_b8,(char *)0x0,true);
      ItemSize(&local_a0,(pIVar4->Style).FramePadding.y);
    }
    EndGroup();
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ImGui::InputScalarEx(const char* label, ImGuiDataType data_type, void* data_ptr, void* step_ptr, void* step_fast_ptr, const char* scalar_format, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    BeginGroup();
    PushID(label);
    const ImVec2 button_sz = ImVec2(g.FontSize, g.FontSize) + style.FramePadding*2.0f;
    if (step_ptr)
        PushItemWidth(ImMax(1.0f, CalcItemWidth() - (button_sz.x + style.ItemInnerSpacing.x)*2));

    char buf[64];
    DataTypeFormatString(data_type, data_ptr, scalar_format, buf, IM_ARRAYSIZE(buf));

    bool value_changed = false;
    if (!(extra_flags & ImGuiInputTextFlags_CharsHexadecimal))
        extra_flags |= ImGuiInputTextFlags_CharsDecimal;
    extra_flags |= ImGuiInputTextFlags_AutoSelectAll;
    if (InputText("", buf, IM_ARRAYSIZE(buf), extra_flags)) // PushId(label) + "" gives us the expected ID from outside point of view
        value_changed = DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, scalar_format);

    // Step buttons
    if (step_ptr)
    {
        PopItemWidth();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '-', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", button_sz, ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups))
        {
            DataTypeApplyOp(data_type, '+', data_ptr, g.IO.KeyCtrl && step_fast_ptr ? step_fast_ptr : step_ptr);
            value_changed = true;
        }
    }
    PopID();

    if (label_size.x > 0)
    {
        SameLine(0, style.ItemInnerSpacing.x);
        RenderText(ImVec2(window->DC.CursorPos.x, window->DC.CursorPos.y + style.FramePadding.y), label);
        ItemSize(label_size, style.FramePadding.y);
    }
    EndGroup();

    return value_changed;
}